

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::GetS2
          (NESTcalc *this,int Ne,double truthPosX,double truthPosY,double truthPosZ,double smearPosX
          ,double smearPosY,double smearPosZ,double dt,double driftVelocity,uint64_t evtNum,
          double dfield,S2CalculationMode mode,int outputTiming,
          vector<long,_std::allocator<long>_> *wf_time,
          vector<double,_std::allocator<double>_> *wf_amp,
          vector<double,_std::allocator<double>_> *g2_params)

{
  ofstream *poVar1;
  NESTcalc *pNVar2;
  pointer pdVar3;
  VDetector *pVVar4;
  pointer pdVar5;
  iterator __position;
  iterator __position_00;
  void *pvVar6;
  bool bVar7;
  uint uVar8;
  RandomGen *pRVar9;
  int64_t iVar10;
  RandomGen *this_00;
  vector<double,_std::allocator<double>_> *pvVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pdVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong N0;
  size_type __new_size;
  long lVar23;
  size_type sVar24;
  ulong N0_00;
  vector<long,_std::allocator<long>_> *this_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  bool YesGas;
  vector<double,_std::allocator<double>_> AreaTableBot [2];
  double phe;
  vector<double,_std::allocator<double>_> AreaTableTop [2];
  vector<double,_std::allocator<double>_> TimeTable;
  vector<double,_std::allocator<double>_> electronstream;
  double offset;
  photonstream photon_times;
  photonstream photon_emission_times;
  double local_2e8;
  double local_2d0;
  double local_2c8;
  double local_290;
  double local_288;
  uint local_280;
  bool local_279;
  long local_278;
  double local_270;
  double local_268;
  double local_260;
  NESTcalc *local_258;
  long lStack_250;
  vector<double,_std::allocator<double>_> local_248;
  vector<double,_std::allocator<double>_> vStack_230;
  double local_218;
  double local_210;
  long local_208;
  ulong local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0 [3];
  vector<double,_std::allocator<double>_> local_1c8;
  vector<double,_std::allocator<double>_> vStack_1b0;
  void *local_198;
  iterator iStack_190;
  double *local_188;
  vector<double,_std::allocator<double>_> local_178;
  vector<double,_std::allocator<double>_> *local_158;
  double local_150;
  double local_148;
  double local_140;
  int local_134;
  double local_130;
  double local_128;
  double local_120;
  vector<long,_std::allocator<long>_> *local_118;
  double local_110;
  void *local_108 [2];
  long local_f8;
  photonstream local_f0;
  photonstream local_d8 [3];
  long local_80;
  double local_78;
  double local_70;
  uint64_t local_68;
  ulong local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pdVar15 = (g2_params->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8 = *pdVar15;
  local_140 = pdVar15[1];
  dVar25 = pdVar15[2];
  local_128 = pdVar15[3];
  local_1e0[0] = pdVar15[4];
  pdVar15 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar3 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_288 = dt;
  local_270 = truthPosX;
  local_268 = truthPosY;
  local_1e0[1] = truthPosZ;
  local_134 = outputTiming;
  local_120 = driftVelocity;
  local_118 = wf_time;
  local_68 = evtNum;
  if (pdVar15 != pdVar3) {
    memset(pdVar15,0,((long)pdVar3 + (-8 - (long)pdVar15) & 0xfffffffffffffff8U) + 8);
  }
  if (mode == WaveformWithEtrain) {
    local_280 = (uint)CONCAT71((int7)((ulong)this->fdetector >> 8),this->fdetector->inGas) ^ 1;
  }
  else {
    local_280 = 0;
  }
  pvVar11 = &this->ionization;
  local_2e8 = 1.0;
  if (((((1.0 <= dfield) && (0.0 < local_1e8)) && (0.0 < local_140)) &&
      ((0.0 < dVar25 && (0.0 < local_128)))) && (0.0 < local_1e0[0])) {
    local_150 = 0.0;
    (*this->fdetector->_vptr_VDetector[6])(local_270,local_268,this->fdetector,0);
    (*this->fdetector->_vptr_VDetector[6])(smearPosX,smearPosY,this->fdetector,1);
    (*this->fdetector->_vptr_VDetector[6])(this->fdetector,0);
    (*this->fdetector->_vptr_VDetector[6])(this->fdetector,1);
    bVar7 = ValidityTests::nearlyEqual(this->fdetector->g1_gas,1.0,1e-09);
    dVar25 = 1.0;
    if (!bVar7) {
      dVar25 = extraout_XMM0_Qa / extraout_XMM0_Qa_01;
      local_2e8 = extraout_XMM0_Qa_00 / extraout_XMM0_Qa_02;
    }
    local_158 = pvVar11;
    bVar7 = ValidityTests::nearlyEqual(this->fdetector->g1_gas,0.0,1e-09);
    local_148 = 0.0;
    if (!bVar7) {
      local_150 = local_2e8;
      local_148 = dVar25;
    }
    pRVar9 = RandomGen::rndm();
    dVar25 = exp(-local_288 / this->fdetector->eLife_us);
    iVar10 = RandomGen::binom_draw(pRVar9,(long)Ne,dVar25 * local_140);
    uVar8 = (uint)iVar10;
    local_130 = (double)(int)uVar8;
    if (mode - Waveform < 2) {
      local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vStack_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      vStack_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      vStack_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      vStack_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      vStack_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      vStack_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_188 = (double *)0x0;
      local_198 = (void *)0x0;
      iStack_190._M_current = (double *)0x0;
      uVar20 = uVar8;
      if ((byte)local_280 != '\0') {
        pRVar9 = RandomGen::rndm();
        dVar25 = exp(-local_288 / this->fdetector->eLife_us);
        iVar10 = RandomGen::binom_draw(pRVar9,(long)Ne,dVar25);
        uVar20 = (uint)iVar10;
      }
      std::vector<double,_std::allocator<double>_>::resize(&local_178,(long)(int)uVar20,&local_288);
      dVar25 = pow(dfield,0.093452);
      dVar26 = exp(dfield * -8.1651e-05);
      dVar26 = dVar26 * dVar25 * 37.368;
      local_258 = (NESTcalc *)pow(dfield,-0.24855);
      local_260 = exp(dfield / -35.661);
      dVar27 = this->fdetector->E_gas * 1000.0;
      dVar28 = pow(dVar27,3.0);
      dVar34 = dVar26 * 0.01;
      dVar25 = dVar34;
      if (this->fdetector->inGas == true) {
        dVar26 = pow(dfield,3.0);
        dVar30 = 124770000.0 / dVar26 + -1739700.0 / (dfield * dfield) + 19097.0 / dfield + 4.265;
        dVar26 = dVar34;
      }
      else {
        dVar30 = (double)local_258 * 66.35 + local_260 * 36.85;
      }
      local_1f0 = (dVar30 + dVar30) * local_288 * 1e-06;
      if (local_1f0 < 0.0) {
        local_1f0 = sqrt(local_1f0);
      }
      else {
        local_1f0 = SQRT(local_1f0);
      }
      local_1f8 = (dVar26 + dVar26) * local_288 * 1e-06;
      if (local_1f8 < 0.0) {
        local_1f8 = sqrt(local_1f8);
      }
      else {
        local_1f8 = SQRT(local_1f8);
      }
      local_279 = true;
      pVVar4 = this->fdetector;
      dVar26 = GetDensity(pVVar4->T_Kelvin,pVVar4->p_bar,&local_279,1,pVVar4->molarMass);
      local_260 = GetDriftVelocity_MagBoltz
                            (dVar26,dVar26,this->fdetector->E_gas * 1000.0,dVar25,
                             this->fdetector->molarMass);
      dVar25 = 124770000.0 / dVar28 + -1739700.0 / (dVar27 * dVar27) + 19097.0 / dVar27 + 4.265;
      dVar26 = local_1e0[0] / local_260;
      local_210 = (dVar25 + dVar25) * dVar26 * 1e-06;
      if (local_210 < 0.0) {
        local_210 = sqrt(local_210);
      }
      else {
        local_210 = SQRT(local_210);
      }
      local_218 = (dVar34 + dVar34) * dVar26 * 1e-06;
      if (local_218 < 0.0) {
        local_218 = sqrt(local_218);
      }
      else {
        local_218 = SQRT(local_218);
      }
      if ((int)uVar20 < 1) {
        local_2c8 = 1e+100;
        local_290 = 0.0;
        lVar16 = 0;
        lVar23 = 0;
        uVar17 = 0;
      }
      else {
        local_1f0 = local_1f0 * 10.0;
        local_1f8 = local_1f8 * 10.0;
        local_210 = local_210 * 10.0;
        local_218 = local_218 * 10.0;
        local_58 = -(5303.0 / (dfield * dfield) + 0.28326);
        uStack_50 = 0x8000000000000000;
        local_70 = (local_260 * 4.5545e-31 * local_260 * 1000000.0) / 1.602e-16;
        local_78 = local_1e0[0] * 0.5;
        local_80 = (long)(int)uVar8;
        local_60 = (ulong)uVar20;
        local_2c8 = 1e+100;
        uVar17 = 0;
        local_200 = 0;
        local_208 = 0;
        local_278 = 0;
        local_290 = 0.0;
        do {
          pRVar9 = RandomGen::rndm();
          dVar25 = RandomGen::rand_gauss(pRVar9,0.0,local_1f0,false);
          pRVar9 = RandomGen::rndm();
          local_2e8 = RandomGen::rand_gauss(pRVar9,0.0,local_1f8,false);
          pRVar9 = RandomGen::rndm();
          dVar26 = RandomGen::rand_uniform(pRVar9);
          local_2e8 = ABS(local_2e8);
          dVar27 = cos(dVar26 * 6.283185307179586);
          dVar26 = sin(dVar26 * 6.283185307179586);
          dVar27 = dVar27 * local_2e8 + local_270;
          dVar26 = dVar26 * local_2e8 + local_268;
          pVVar4 = this->fdetector;
          if (dVar27 * dVar27 + dVar26 * dVar26 <= pVVar4->radmax * pVVar4->radmax) {
            dVar25 = dVar25 / local_120 + 0.0;
            if ((pVVar4->inGas == false) && ((pVVar4->E_gas != 0.0 || (NAN(pVVar4->E_gas))))) {
              pRVar9 = RandomGen::rndm();
              dVar28 = RandomGen::rand_uniform(pRVar9);
              dVar28 = log(dVar28);
              dVar25 = dVar25 + dVar28 * local_58;
            }
            local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] =
                 dVar25 + local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17];
            pRVar9 = RandomGen::rndm();
            dVar25 = this->fdetector->s2Fano * local_1e8;
            if (dVar25 < 0.0) {
              dVar25 = sqrt(dVar25);
            }
            else {
              dVar25 = SQRT(dVar25);
            }
            dVar25 = RandomGen::rand_gauss(pRVar9,local_1e8,dVar25,true);
            dVar25 = floor(dVar25 + 0.5);
            pRVar9 = RandomGen::rndm();
            N0_00 = (long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25;
            iVar10 = RandomGen::binom_draw(pRVar9,N0_00,this->fdetector->g1_gas * local_148);
            dVar28 = (double)iVar10;
            local_258 = (NESTcalc *)(dVar28 - 9.223372036854776e+18);
            lStack_250 = 0;
            dVar25 = this->fdetector->TopDrift;
            dVar34 = floor(dVar28 * 0.0566 + 0.5);
            GetPhotonTimes(local_d8,this,beta,(int)iVar10,(int)dVar34,dfield,local_70);
            AddPhotonTransportTime(&local_f0,this,local_d8,dVar27,dVar26,dVar25 + local_78);
            pRVar9 = RandomGen::rndm();
            N0 = (long)(double)local_258 & (long)dVar28 >> 0x3f | (long)dVar28;
            iVar10 = RandomGen::binom_draw(pRVar9,N0,this->fdetector->P_dphe);
            dVar28 = dVar28 + (double)iVar10;
            local_48 = dVar28 - 9.223372036854776e+18;
            uStack_40 = 0;
            pRVar9 = RandomGen::rndm();
            dVar25 = RandomGen::rand_gauss(pRVar9,0.0,local_210,false);
            pRVar9 = RandomGen::rndm();
            RandomGen::rand_gauss(pRVar9,0.0,local_218,false);
            pRVar9 = RandomGen::rndm();
            dVar26 = RandomGen::rand_uniform(pRVar9);
            cos(dVar26 * 6.283185307179586);
            sin(dVar26 * 6.283185307179586);
            local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] =
                 dVar25 / local_260 +
                 local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
            bVar19 = local_80 <= (long)uVar17 & (byte)local_280;
            if (bVar19 == 1) {
              dVar25 = this->fdetector->TopDrift;
              dVar27 = this->fdetector->E_gas / 1.8476719333639615;
              dVar26 = exp(dVar27 * 0.15578);
              dVar27 = exp(dVar27 * 0.21177);
              pRVar9 = RandomGen::rndm();
              dVar34 = RandomGen::rand_uniform(pRVar9);
              if (((dVar27 * 0.38157 * 0.01) / 0.035) * local_140 <= dVar34) {
                pRVar9 = RandomGen::rndm();
                dVar25 = RandomGen::rand_uniform(pRVar9);
                dVar25 = log(dVar25);
                local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17] =
                     dVar26 * 1.4054 * 1000.0 * -0.01 * dVar25 +
                     local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17];
              }
              else {
                pRVar9 = RandomGen::rndm();
                dVar26 = RandomGen::rand_uniform(pRVar9);
                dVar26 = (dVar25 / local_120) / dVar26;
                dVar25 = 1000000.0;
                if (dVar26 <= 1000000.0) {
                  dVar25 = dVar26;
                }
                local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17] =
                     dVar25 + local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar17];
              }
            }
            if (0.0 < dVar28) {
              local_2e8 = 0.0;
              local_2d0 = local_2c8;
              do {
                pRVar9 = RandomGen::rndm();
                this_00 = RandomGen::rndm();
                dVar25 = RandomGen::FindNewMean(this_00,this->fdetector->sPEres);
                local_1e0[2] = RandomGen::rand_zero_trunc_gauss
                                         (pRVar9,1.0 / dVar25,this->fdetector->sPEres);
                if (bVar19 == 0) {
                  local_290 = local_290 + local_1e0[2];
                }
                dVar25 = this->fdetector->TopDrift;
                pRVar9 = RandomGen::rndm();
                dVar26 = RandomGen::rand_uniform(pRVar9);
                uVar14 = (long)(local_2e8 - 9.223372036854776e+18) & (long)local_2e8 >> 0x3f |
                         (long)local_2e8;
                uVar13 = (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3;
                uVar18 = 0;
                if (uVar13 <= uVar14) {
                  uVar18 = uVar13;
                }
                local_2c8 = ((this->fdetector->anode - (dVar26 * local_1e0[0] + dVar25)) / local_260
                            + local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar17]) * 1000.0 +
                            local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar14 - uVar18];
                local_110 = local_2c8;
                pRVar9 = RandomGen::rndm();
                dVar25 = RandomGen::rand_uniform(pRVar9);
                (*this->fdetector->_vptr_VDetector[7])(local_270,local_268,local_1e0[1],local_108);
                pNVar2 = (NESTcalc *)*(double *)((long)local_108[0] + 8);
                if (local_108[0] != (void *)0x0) {
                  local_258 = (NESTcalc *)*(double *)((long)local_108[0] + 8);
                  operator_delete(local_108[0],local_f8 - (long)local_108[0]);
                  pNVar2 = local_258;
                }
                if ((double)pNVar2 <= dVar25) {
                  local_108[0] = (void *)0x0;
                  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              (&local_248,
                               (iterator)
                               local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(double *)local_108);
                  }
                  else {
                    *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = 0.0;
                    local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    *local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_1e0[2];
                    goto LAB_0010d182;
                  }
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                            ((vector<double,std::allocator<double>> *)&local_1c8,
                             (iterator)
                             local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,local_1e0 + 2);
                }
                else {
                  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                              ((vector<double,std::allocator<double>> *)&local_248,
                               (iterator)
                               local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,local_1e0 + 2);
                  }
                  else {
                    *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_1e0[2];
                    local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  local_108[0] = (void *)0x0;
                  if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              (&local_1c8,
                               (iterator)
                               local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(double *)local_108);
                  }
                  else {
                    *local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = 0.0;
LAB_0010d182:
                    local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
                if (iStack_190._M_current == local_188) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                            ((vector<double,std::allocator<double>> *)&local_198,iStack_190,
                             &local_110);
                }
                else {
                  *iStack_190._M_current = local_110;
                  iStack_190._M_current = iStack_190._M_current + 1;
                }
                if (local_2d0 <= local_2c8) {
                  local_2c8 = local_2d0;
                }
                local_2e8 = local_2e8 + 1.0;
                local_2d0 = local_2c8;
              } while (local_2e8 < dVar28);
            }
            if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_f0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_f0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_d8[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_d8[0].super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_d8[0].super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            local_200 = local_200 + N0_00;
            local_208 = local_208 + N0;
            local_278 = local_278 + ((long)local_48 & (long)dVar28 >> 0x3f | (long)dVar28);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != local_60);
        local_2c8 = local_2c8 + -50.0;
        uVar17 = local_200;
        lVar23 = local_208;
        lVar16 = local_278;
      }
      uVar8 = (int)lVar16 * 1000;
      __new_size = 100;
      if (100 < (int)uVar8) {
        __new_size = (size_type)uVar8;
      }
      local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_258 = this;
      std::vector<double,_std::allocator<double>_>::resize
                (&vStack_230,__new_size,(value_type *)local_d8);
      this_01 = local_118;
      local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (double *)0x0;
      local_208 = lVar23;
      local_200 = uVar17;
      std::vector<double,_std::allocator<double>_>::resize
                (&vStack_1b0,__new_size,(value_type *)local_d8);
      local_278 = lVar16;
      if (lVar16 != 0) {
        uVar8 = (int)__new_size - 1;
        lVar23 = 0;
        do {
          bVar7 = ValidityTests::nearlyEqual
                            (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar23],0.0,1e-09);
          if (bVar7) {
            (*local_258->fdetector->_vptr_VDetector[9])
                      (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23],local_d8);
          }
          else {
            (*local_258->fdetector->_vptr_VDetector[9])
                      (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23],local_d8);
          }
          pdVar3 = local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pdVar15 = local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar21 = (int)((ulong)((long)local_d8[0].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)local_d8[0].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3);
          if (1 < iVar21) {
            iVar21 = iVar21 + -1;
            iVar22 = 0;
            do {
              dVar25 = *pdVar15;
              bVar7 = ValidityTests::nearlyEqual
                                (local_248.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar23],0.0,1e-09);
              dVar26 = floor((dVar25 + (double)iVar22) / 10.0 + 0.5);
              uVar20 = (int)dVar26;
              if ((int)dVar26 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar8 <= (int)uVar20) {
                uVar20 = uVar8;
              }
              dVar25 = ((dVar25 + (double)iVar22) - *(double *)((long)local_198 + lVar23 * 8)) +
                       local_2c8;
              pvVar11 = &local_248;
              if (bVar7) {
                pvVar11 = &local_1c8;
              }
              dVar26 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar23];
              pvVar11 = &vStack_230;
              if (bVar7) {
                pvVar11 = &vStack_1b0;
              }
              dVar25 = exp((dVar25 * dVar25) / -200.0);
              pdVar5 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar5[uVar20] = dVar25 * ((dVar26 * 10.0) / 25.06628274631001) + pdVar5[uVar20];
              iVar22 = iVar22 + 10;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          if (pdVar15 != (double *)0x0) {
            operator_delete(pdVar15,(long)pdVar3 - (long)pdVar15);
          }
          lVar23 = lVar23 + 1;
          this_01 = local_118;
        } while (lVar23 != local_278);
      }
      pdVar15 = (pointer)(long)(local_2c8 + 5.0);
      poVar1 = &local_258->pulseFile;
      local_2e8 = 0.0;
      sVar24 = 0;
      local_2c8 = 0.0;
      do {
        if (0.005 < vStack_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar24] +
                    vStack_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar24]) {
          __position._M_current =
               (this_01->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this_01->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = pdVar15;
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<unsigned_long>
                      (this_01,__position,(unsigned_long *)local_d8);
          }
          else {
            *__position._M_current = (long)pdVar15;
            (this_01->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(vStack_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar24] +
                        vStack_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar24]);
          __position_00._M_current =
               (wf_amp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (wf_amp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (wf_amp,__position_00,(double *)local_d8);
          }
          else {
            *__position_00._M_current =
                 (double)local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (wf_amp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
          if (-1 < local_134) {
            dVar25 = vStack_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar24];
            local_2e8 = (double)(-(ulong)(140.0 < dVar25) & (ulong)(dVar25 + -140.0));
            dVar26 = vStack_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar24];
            local_2c8 = (double)(-(ulong)(140.0 < dVar26) & (ulong)(dVar26 + -140.0));
            snprintf((char *)local_d8,0x50,"%llu\t%lld\t%.3f\t%.3f",dVar25 - local_2e8,
                     dVar26 - local_2c8,local_68,
                     (this_01->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish[-1]);
            sVar12 = strlen((char *)local_d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_d8,sVar12);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
            std::ostream::put((char)poVar1);
            std::ostream::flush();
          }
        }
        sVar24 = sVar24 + 1;
        pdVar15 = (pointer)((long)pdVar15 + 10);
      } while (__new_size != sVar24);
      if (local_198 != (void *)0x0) {
        operator_delete(local_198,(long)local_188 - (long)local_198);
      }
      pvVar11 = local_158;
      uVar17 = local_200;
      lVar23 = local_208;
      this = local_258;
      lVar16 = 0x30;
      do {
        pvVar6 = *(void **)((long)local_1e0 + lVar16);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,*(long *)((long)local_1e0 + lVar16 + 0x10) - (long)pvVar6);
        }
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != 0);
      lVar16 = 0x30;
      do {
        pvVar6 = *(void **)((long)&local_260 + lVar16);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,*(long *)((long)&lStack_250 + lVar16) - (long)pvVar6);
        }
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != 0);
      if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      pRVar9 = RandomGen::rndm();
      dVar26 = local_1e8 * local_130;
      dVar25 = local_1e8 * this->fdetector->s2Fano * local_130;
      if (dVar25 < 0.0) {
        dVar25 = sqrt(dVar25);
      }
      else {
        dVar25 = SQRT(dVar25);
      }
      pvVar11 = local_158;
      dVar25 = RandomGen::rand_gauss(pRVar9,dVar26,dVar25,true);
      dVar25 = floor(dVar25 + 0.5);
      uVar17 = (long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25;
      pRVar9 = RandomGen::rndm();
      lVar23 = RandomGen::binom_draw(pRVar9,uVar17,local_148 * this->fdetector->g1_gas);
      pRVar9 = RandomGen::rndm();
      iVar10 = RandomGen::binom_draw(pRVar9,lVar23,this->fdetector->P_dphe);
      lVar16 = iVar10 + lVar23;
      pRVar9 = RandomGen::rndm();
      dVar26 = RandomGen::FindNewMean(pRVar9,this->fdetector->sPEres);
      pRVar9 = RandomGen::rndm();
      auVar29._8_4_ = (int)((ulong)lVar16 >> 0x20);
      auVar29._0_8_ = lVar16;
      auVar29._12_4_ = 0x45300000;
      dVar26 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) / dVar26;
      dVar25 = this->fdetector->sPEres;
      local_278 = lVar16;
      if (dVar26 < 0.0) {
        dVar27 = sqrt(dVar26);
      }
      else {
        dVar27 = SQRT(dVar26);
      }
      local_290 = RandomGen::rand_gauss(pRVar9,dVar26,dVar25 * dVar27,true);
      local_2c8 = 0.0;
      local_2e8 = 0.0;
    }
    if (1.0 <= this->fdetector->noiseLinear[1]) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 " !!WARNING!! S2 linear noise term is greater than or equal to 100% (i.e. 1.0) Did you mistake fraction for percent??"
                 ,0x74);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
    }
    dVar25 = this->fdetector->noiseQuadratic[1];
    pRVar9 = RandomGen::rndm();
    pVVar4 = this->fdetector;
    if ((dVar25 != 0.0) || (NAN(dVar25))) {
      dVar26 = local_290 * local_290 * pVVar4->noiseQuadratic[1];
      dVar25 = pVVar4->noiseLinear[1] * local_290;
      dVar25 = dVar25 * dVar25 + dVar26 * dVar26;
      if (dVar25 < 0.0) {
        dVar25 = sqrt(dVar25);
      }
      else {
        dVar25 = SQRT(dVar25);
      }
    }
    else {
      dVar25 = pVVar4->noiseLinear[1] * local_290;
    }
    dVar28 = RandomGen::rand_gauss(pRVar9,local_290,dVar25,true);
    dVar28 = dVar28 - (local_2c8 + local_2e8);
    dVar34 = exp(-local_288 / this->fdetector->eLife_us);
    dVar25 = this->fdetector->P_dphe;
    pRVar9 = RandomGen::rndm();
    (*this->fdetector->_vptr_VDetector[7])(local_270,local_268,local_1e0[1],local_d8);
    dVar26 = local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    (*this->fdetector->_vptr_VDetector[7])(local_270,local_268,local_1e0[1],&local_248);
    dVar27 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    (*this->fdetector->_vptr_VDetector[7])(local_270,local_268,local_1e0[1],&local_1c8);
    dVar27 = (1.0 - local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[1]) * dVar27 * dVar28;
    if (dVar27 < 0.0) {
      dVar27 = sqrt(dVar27);
    }
    else {
      dVar27 = SQRT(dVar27);
    }
    dVar26 = RandomGen::rand_gauss(pRVar9,dVar26 * dVar28,dVar27,true);
    if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    dVar27 = exp(-local_288 / this->fdetector->eLife_us);
    pdVar15 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    *pdVar15 = local_130;
    auVar31._8_4_ = (int)(uVar17 >> 0x20);
    auVar31._0_8_ = uVar17;
    auVar31._12_4_ = 0x45300000;
    pdVar15[1] = (auVar31._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
    auVar32._8_4_ = (int)((ulong)lVar23 >> 0x20);
    auVar32._0_8_ = lVar23;
    auVar32._12_4_ = 0x45300000;
    pdVar15[2] = (auVar32._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0);
    auVar33._8_4_ = (int)((ulong)local_278 >> 0x20);
    auVar33._0_8_ = local_278;
    auVar33._12_4_ = 0x45300000;
    pdVar15[3] = (auVar33._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_278) - 4503599627370496.0);
    pVVar4 = this->fdetector;
    if (0.0 <= pVVar4->s2_thr) {
      dVar27 = (dVar28 / dVar34) / local_150;
      dVar25 = dVar25 + 1.0;
      pdVar15[4] = dVar28;
      pdVar15[5] = dVar27;
      dVar27 = dVar27 / dVar25;
      pdVar15[6] = dVar28 / dVar25;
    }
    else {
      dVar27 = (dVar26 / dVar27) / local_150;
      pdVar15[4] = dVar26;
      pdVar15[5] = dVar27;
      pdVar15[6] = dVar26 / (pVVar4->P_dphe + 1.0);
      dVar27 = dVar27 / (pVVar4->P_dphe + 1.0);
    }
    pdVar15[7] = dVar27;
    if (dVar28 < ABS(pVVar4->s2_thr)) {
      lVar23 = 0;
      do {
        bVar7 = ValidityTests::nearlyEqual
                          ((pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar23],0.0,1e-09);
        if (bVar7) {
          (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar23] = 1e-06;
        }
        pdVar15 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar15[lVar23] = (double)((ulong)pdVar15[lVar23] | (ulong)DAT_00114240);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 8);
    }
    (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[8] = local_128;
  }
  return pvVar11;
}

Assistant:

const vector<double> &NESTcalc::GetS2(
    int Ne, double truthPosX, double truthPosY, double truthPosZ,
    double smearPosX, double smearPosY, double smearPosZ, double dt,
    double driftVelocity, uint64_t evtNum, double dfield,
    S2CalculationMode mode, int outputTiming, vector<int64_t> &wf_time,
    vector<double> &wf_amp, const vector<double> &g2_params) {
  double elYield = g2_params[0];
  double ExtEff = g2_params[1];
  double SE = g2_params[2];
  double g2 = g2_params[3];
  double gasGap = g2_params[4];

  std::fill(ionization.begin(), ionization.end(), 0);

  double subtract[2] = {0., 0.};
  int i;
  bool eTrain = false;
  if (mode == S2CalculationMode::WaveformWithEtrain &&
      !fdetector->get_inGas()) {
    eTrain = true;
  }

  if (dfield < FIELD_MIN  //"zero"-drift-field detector has no S2
      || elYield <= 0. || ExtEff <= 0. || SE <= 0. || g2 <= 0. ||
      gasGap <= 0.) {
    return ionization;
  }

  // Add some variability in g1_gas drawn from a polynomial spline fit
  double posDep =
      fdetector->FitS2(truthPosX, truthPosY,
                       VDetector::fold);  // XY is always in mm now, never cm
  double posDepSm;
  if (XYcorr == 2 || XYcorr == 3) {
    posDepSm = fdetector->FitS2(smearPosX, smearPosY, VDetector::unfold);
  } else {
    posDepSm = fdetector->FitS2(0, 0, VDetector::unfold);
  }
  posDep /= fdetector->FitS2(0., 0., VDetector::fold);
  posDepSm /= fdetector->FitS2(0., 0., VDetector::unfold);
  double dz = fdetector->get_TopDrift() - dt * driftVelocity;

  if (ValidityTests::nearlyEqual(fdetector->get_g1_gas(), 1.)) {
    posDep = 1.;
    posDepSm = 1.;
  }
  if (ValidityTests::nearlyEqual(fdetector->get_g1_gas(), 0.)) {
    posDep = 0.;
    posDepSm = 0.;
  }

  int Nee = RandomGen::rndm()->binom_draw(
      Ne, ExtEff * exp(-dt / fdetector->get_eLife_us()));
  // MAKE this 1 for SINGLE e- DEBUG

  uint64_t Nph = 0, nHits = 0, Nphe = 0;
  double pulseArea = 0.;

  if (mode == S2CalculationMode::Waveform ||
      mode == S2CalculationMode::WaveformWithEtrain) {
    uint64_t k;
    int stopPoint;
    double tau1, tau2, E_liq, amp2;
    vector<double> electronstream, AreaTableBot[2], AreaTableTop[2], TimeTable;
    if (eTrain) {
      stopPoint = RandomGen::rndm()->binom_draw(
          Ne, exp(-dt / fdetector->get_eLife_us()));
    } else {
      stopPoint = Nee;
    }
    electronstream.resize(stopPoint, dt);
    double elecTravT = 0., DL, DL_time, DT, phi, sigX, sigY, newX, newY;
    double Diff_Tran =
      GetDiffTran_Liquid(dfield, false, fdetector->get_T_Kelvin(), fdetector->get_p_bar(), DENSITY, ATOM_NUM);
    double Diff_Long =
      GetDiffLong_Liquid(dfield, false, fdetector->get_T_Kelvin(), fdetector->get_p_bar(), DENSITY, ATOM_NUM);

    // a good rule of thumb but only for liquids, as gas kind of opposite:
    // Diff_Long ~ 0.15 * Diff_Tran, as it is in LAr, at least as field goes to
    // infinity
    double Diff_Long_Gas =
        4.265 + 19097. / (1e3 * fdetector->get_E_gas()) -
        1.7397e6 / pow(1e3 * fdetector->get_E_gas(), 2.) +
        1.2477e8 / pow(1e3 * fdetector->get_E_gas(), 3.);  // Nygren, NEXT
    double Diff_Tran_Gas = Diff_Tran * 0.01;
    if (fdetector->get_inGas()) {
      Diff_Tran *= 0.01;
      Diff_Long = 4.265 + 19097. / dfield - 1.7397e6 / pow(dfield, 2.) +
                  1.2477e8 / pow(dfield, 3.);
    }
    double sigmaDL =
        10. * sqrt(2. * Diff_Long * dt *
                   1e-6);  // sqrt of cm^2/s * s = cm; times 10 for mm.
    double sigmaDT = 10. * sqrt(2. * Diff_Tran * dt * 1e-6);
    bool YesGas = true;
    double rho = GetDensity(fdetector->get_T_Kelvin(), fdetector->get_p_bar(),
                            YesGas, 1, fdetector->get_molarMass());
    double driftVelocity_gas =
      GetDriftVelocity_MagBoltz(fdetector->get_T_Kelvin(), rho, fdetector->get_E_gas() * 1000., fdetector->get_p_bar(), fdetector->get_molarMass());
    double dt_gas = gasGap / driftVelocity_gas;
    double sigmaDLg = 10. * sqrt(2. * Diff_Long_Gas * dt_gas * 1e-6);
    double sigmaDTg = 10. * sqrt(2. * Diff_Tran_Gas * dt_gas * 1e-6);
    double tauTrap = 0.28326 + 5303/(dfield*dfield);  // microseconds, to match
    // LZ SR3, LUX Run03, Xe100/10. 0.185 (fixed) based on 1310.1117 (Gaussian)
    double min = 1e100;
    for (i = 0; i < stopPoint; ++i) {
      elecTravT = 0.;  // resetting for the current electron
      DL = RandomGen::rndm()->rand_gauss(0., sigmaDL, false);
      DT = std::abs(RandomGen::rndm()->rand_gauss(0., sigmaDT, false));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      sigX = DT * cos(phi);
      sigY = DT * sin(phi);
      newX = truthPosX + sigX;
      newY = truthPosY + sigY;
      if (newX * newX + newY * newY >
          fdetector->get_radmax() * fdetector->get_radmax()) {
        continue;  // remove electrons from outside the maximum possible radius
                   // (alternative is squeeze them, depending on your E-fields)
      }
      DL_time = DL / driftVelocity;
      elecTravT += DL_time;
      if (!fdetector->get_inGas() && fdetector->get_E_gas() != 0.) {
        elecTravT -= tauTrap * log(RandomGen::rndm()->rand_uniform());
      }
      electronstream[i] += elecTravT;
      SE = floor(RandomGen::rndm()->rand_gauss(
                     elYield, sqrt(fdetector->get_s2Fano() * elYield), true) +
                 0.5);
      Nph += uint64_t(SE);
      SE = (double)RandomGen::rndm()->binom_draw(
          uint64_t(SE), fdetector->get_g1_gas() * posDep);
      nHits += uint64_t(SE);
      double KE = 0.5 * 9.109e-31 * driftVelocity_gas * driftVelocity_gas *
                  1e6 / 1.602e-16;
      double origin = fdetector->get_TopDrift() + gasGap / 2.;
      QuantaResult quanta{};
      quanta.photons = int(SE);
      quanta.electrons = 0;
      quanta.ions = 0;
      quanta.excitons = int(floor(0.0566 * SE + 0.5));
      photonstream photon_emission_times = GetPhotonTimes(
          NEST::beta, quanta.photons, quanta.excitons, dfield, KE);
      photonstream photon_times =
          AddPhotonTransportTime(photon_emission_times, newX, newY, origin);
      SE += (double)RandomGen::rndm()->binom_draw(uint64_t(SE),
                                                  fdetector->get_P_dphe());
      Nphe += uint64_t(SE);
      DL = RandomGen::rndm()->rand_gauss(0., sigmaDLg, false);
      DT = std::abs(RandomGen::rndm()->rand_gauss(0., sigmaDTg, false));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      sigX = DT * cos(phi);
      sigY = DT * sin(phi);
      newX += sigX;
      newY += sigY;
      DL_time = DL / driftVelocity_gas;
      electronstream[i] += DL_time;
      if (i >= Nee && eTrain) {  // exponential based on arXiv:1711.07025, power
                                 // on 2004.07791
        E_liq = fdetector->get_E_gas() / (EPS_LIQ / std::abs(EPS_GAS));
        tau2 = (fdetector->get_TopDrift() /
                driftVelocity);  // 0.58313 * exp(0.20929 * E_liq) * 1e3;
        tau1 = 1.40540 * exp(0.15578 * E_liq) * 1e3 * 1e-2;
        amp2 = 0.38157 * exp(0.21177 * E_liq) * 1e-2;
        if (RandomGen::rndm()->rand_uniform() < (amp2 / 0.035) * ExtEff) {
          tau2 /= RandomGen::rndm()->rand_uniform();
          if (tau2 > 1e6) tau2 = 1e6;  // 1 sec. cap
          electronstream[i] += tau2;
        } else {
          electronstream[i] -= tau1 * log(RandomGen::rndm()->rand_uniform());
        }
      }
      for (double j = 0.; j < SE; j += 1.) {
        double phe = RandomGen::rndm()->rand_zero_trunc_gauss(
            1. / RandomGen::rndm()->FindNewMean(fdetector->get_sPEres()),
            fdetector->get_sPEres());
        if (i < Nee || !eTrain) pulseArea += phe;
        origin = fdetector->get_TopDrift() +
                 gasGap * RandomGen::rndm()->rand_uniform();
        k = uint64_t(j);
        if (k >= photon_times.size()) k -= photon_times.size();
        double offset = ((fdetector->get_anode() - origin) / driftVelocity_gas +
                         electronstream[i]) *
                            1e3 +
                        photon_times[k];
        if (offset < min) min = offset;
        if (RandomGen::rndm()->rand_uniform() <
            fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1]) {
          AreaTableBot[0].emplace_back(phe);
          AreaTableTop[0].emplace_back(0.0);
        } else {
          AreaTableBot[0].emplace_back(0.0);
          AreaTableTop[0].emplace_back(phe);
        }
        TimeTable.emplace_back(offset);
      }
    }
    int numPts = Nphe * 1000;
    if (numPts < 1000 / SAMPLE_SIZE) numPts = 1000 / SAMPLE_SIZE;
    AreaTableBot[1].resize(numPts, 0.);
    AreaTableTop[1].resize(numPts, 0.);
    min -= 5. * SAMPLE_SIZE;
    for (k = 0; k < Nphe; ++k) {
      vector<double> PEperBin;
      if (ValidityTests::nearlyEqual(AreaTableBot[0][k], 0.0))
        PEperBin =
            fdetector->SinglePEWaveForm(AreaTableTop[0][k], TimeTable[k] - min);
      else {
        PEperBin =
            fdetector->SinglePEWaveForm(AreaTableBot[0][k], TimeTable[k] - min);
      }
      for (i = 0; i < int(PEperBin.size()) - 1; ++i) {
        double eTime = PEperBin[0] + i * SAMPLE_SIZE;
        int index = int(floor(eTime / SAMPLE_SIZE + 0.5));
        index = NESTcalc::clamp(index, 0, numPts - 1);
        if (ValidityTests::nearlyEqual(AreaTableBot[0][k], 0.0))
          AreaTableTop[1][index] += 10. * AreaTableTop[0][k] /
                                    (PULSE_WIDTH * sqrt2_PI) *
                                    exp(-pow(eTime - TimeTable[k] + min, 2.) /
                                        (2. * PULSE_WIDTH * PULSE_WIDTH));
        else {
          AreaTableBot[1][index] += 10. * AreaTableBot[0][k] /
                                    (PULSE_WIDTH * sqrt2_PI) *
                                    exp(-pow(eTime - TimeTable[k] + min, 2.) /
                                        (2. * PULSE_WIDTH * PULSE_WIDTH));
        }
      }
    }
    for (k = 0; k < numPts; ++k) {
      if ((AreaTableBot[1][k] + AreaTableTop[1][k]) <= PULSEHEIGHT) continue;
      wf_time.emplace_back(k * SAMPLE_SIZE + int64_t(min + SAMPLE_SIZE / 2.));
      wf_amp.emplace_back(AreaTableBot[1][k] + AreaTableTop[1][k]);

      if (outputTiming >= 0) {
        char line[80];
        if (AreaTableBot[1][k] > PHE_MAX)
          subtract[0] = AreaTableBot[1][k] - PHE_MAX;
        else {
          subtract[0] = 0.0;
        }
        if (AreaTableTop[1][k] > PHE_MAX)
          subtract[1] = AreaTableTop[1][k] - PHE_MAX;
        else {
          subtract[1] = 0.0;
        }
        snprintf(line, 80, "%llu\t%lld\t%.3f\t%.3f",
                 (long long unsigned int)evtNum, (long long int)wf_time.back(),
                 AreaTableBot[1][k] - subtract[0],
                 AreaTableTop[1][k] - subtract[1]);
        pulseFile << line << endl;
      }
    }
  } else {
    Nph = uint64_t(
        floor(RandomGen::rndm()->rand_gauss(
                  elYield * double(Nee),
                  sqrt(fdetector->get_s2Fano() * elYield * double(Nee)), true) +
              0.5));
    nHits =
        RandomGen::rndm()->binom_draw(Nph, fdetector->get_g1_gas() * posDep);
    Nphe =
        nHits + RandomGen::rndm()->binom_draw(nHits, fdetector->get_P_dphe());
    double NewMean = RandomGen::rndm()->FindNewMean(fdetector->get_sPEres());
    pulseArea = RandomGen::rndm()->rand_gauss(
        Nphe / NewMean, fdetector->get_sPEres() * sqrt(Nphe / NewMean), true);
  }

  if (fdetector->get_noiseLinear()[1] >= 1.0)
    cerr << " !!WARNING!! S2 linear noise term is greater than or equal to 100% "
            "(i.e. 1.0) Did you mistake fraction for percent??"
         << endl;
  if (fdetector->get_noiseQuadratic()[1] != 0) {
    pulseArea = RandomGen::rndm()->rand_gauss(
        pulseArea,
        sqrt(pow(fdetector->get_noiseQuadratic()[1] * pow(pulseArea, 2), 2) +
             pow(fdetector->get_noiseLinear()[1] * pulseArea, 2)),
        true);
  } else {
    pulseArea = RandomGen::rndm()->rand_gauss(
        pulseArea, fdetector->get_noiseLinear()[1] * pulseArea, true);
  }
  pulseArea -= (subtract[0] + subtract[1]);
  double pulseAreaC =
      pulseArea / exp(-dt / fdetector->get_eLife_us()) / posDepSm;
  double Nphd = pulseArea / (1. + fdetector->get_P_dphe());
  double NphdC = pulseAreaC / (1. + fdetector->get_P_dphe());

  double S2b = RandomGen::rndm()->rand_gauss(
      fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1] * pulseArea,
      sqrt(fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1] * pulseArea *
           (1. - fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1])),
      true);
  double S2bc =
      S2b / exp(-dt / fdetector->get_eLife_us()) /
      posDepSm;  // for detectors using S2 bottom-only in their analyses

  ionization[0] = Nee;  // integer number of electrons unabsorbed in liquid then
  // getting extracted
  ionization[1] = Nph;    // raw number of photons produced in the gas gap
  ionization[2] = nHits;  // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  ionization[3] = Nphe;  // MC-true integer hits WITH double phe effect (Nphe >
  // nHits). S2 has more steps than S1 (e's 1st)
  if (fdetector->get_s2_thr() >= 0) {
    ionization[4] = pulseArea;  // floating real# smeared DAQ pulse areas in
    // phe, NO XYZ correction
    ionization[5] =
        pulseAreaC;  // smeared DAQ pulse areas in phe, WITH XYZ correction
    ionization[6] = Nphd;  // same as pulse area, adjusted/corrected *downward*
    // for 2-PE effect (LUX phd units)
    ionization[7] = NphdC;  // same as Nphd, but XYZ-corrected
  }
  // Negative S2 threshold is a hidden feature, which switches from S2 -> S2
  // bottom (NOT literally negative)
  else {
    ionization[4] = S2b;  // floating real# smeared pulse areas in phe ONLY
    // including bottom PMTs, NO XYZ correction
    ionization[5] = S2bc;  // floating real# smeared pulse areas in phe ONLY
    // including bottom PMTs, WITH XYZ correction
    ionization[6] =
        S2b / (1. + fdetector->get_P_dphe());  // same as S2b, but adjusted for
    // 2-PE effect (LUX phd units)
    ionization[7] = S2bc / (1. + fdetector->get_P_dphe());  // same as S2bc, but
                                                            // adjusted for 2-PE
                                                            // effect (LUX phd
                                                            // units)
  }

  if (pulseArea < std::abs(fdetector->get_s2_thr())) {
    for (i = 0; i < 8; ++i) {
      if (ValidityTests::nearlyEqual(ionization[i], 0.))
        ionization[i] = PHE_MIN;
      ionization[i] = -1. * std::abs(ionization[i]);
    }
  }

  ionization[8] =
      g2;  // g2 = ExtEff * SE, gain of EL in gas gap (from CalculateG2)

  return ionization;
}